

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void google::protobuf::internal::(anonymous_namespace)::
     SupportsExpectedInputType<google::protobuf::internal::MicroStringExtraImpl<15ul>,std::__cxx11::string_const&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  bool bVar1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  AssertHelper local_128;
  Message local_120;
  string_view local_118;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  MicroStringExtraImpl<15UL> str;
  undefined1 local_d8 [8];
  Arena arena;
  string control;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  
  MakeControl<std::__cxx11::string>
            ((string *)&arena.impl_.first_arena_.cached_blocks_,(_anonymous_namespace_ *)t,in_RDX);
  Arena::Arena((Arena *)local_d8);
  MicroStringExtraImpl<15UL>::MicroStringExtraImpl((MicroStringExtraImpl<15UL> *)&gtest_ar.message_)
  ;
  MicroStringExtraImpl<15UL>::Set
            ((MicroStringExtraImpl<15UL> *)&gtest_ar.message_,t,(Arena *)local_d8);
  local_118 = MicroString::Get((MicroString *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_108,"str.Get()","control",&local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &arena.impl_.first_arena_.cached_blocks_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0xf7,message);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  Arena::~Arena((Arena *)local_d8);
  std::__cxx11::string::~string((string *)&arena.impl_.first_arena_.cached_blocks_);
  return;
}

Assistant:

void SupportsExpectedInputType(T&& t) {
  const std::string control = MakeControl(t);

  Arena arena;
  S str;
  str.Set(std::forward<T>(t), &arena);
  EXPECT_EQ(str.Get(), control);
}